

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeTrackerDevice.cpp
# Opt level: O2

VRInputDevice *
MinVR::VRFakeTrackerDevice::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  VRVector3 lookAtEye;
  VRVector3 lookAtCenter;
  int iVar1;
  int iVar2;
  VRAnyCoreType VVar3;
  VRFakeTrackerDevice *this;
  float xyScale;
  float zScale;
  float rotScale;
  float fVar4;
  undefined1 in_stack_fffffffffffffb7c [20];
  undefined1 auStack_470 [16];
  string style;
  string devNameSpace;
  VRFloatArray defaultPos;
  string rollEvent;
  string translateZEvent;
  float up [3];
  float local_3a4;
  float ctr [3];
  float local_394;
  string translateEvent;
  string rotateEvent;
  VRFloatArray defaultCtr;
  string toggleEvent;
  VRVector3 startUp;
  VRVector3 startCtr;
  VRFloatArray defaultUp;
  _Vector_base<float,_std::allocator<float>_> local_2c8;
  _Vector_base<float,_std::allocator<float>_> local_2b0;
  _Vector_base<float,_std::allocator<float>_> local_298;
  VRVector3 startPos;
  float pos [3];
  float local_25c;
  VRVector3 local_258;
  VRVector3 local_240;
  VRVector3 local_228;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string trackerName;
  
  std::__cxx11::string::string((string *)&devNameSpace,(string *)nameSpace);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&toggleEvent,"TrackerName",(allocator<char> *)&rotateEvent);
  std::__cxx11::string::string((string *)&local_70,(string *)&devNameSpace);
  VVar3 = VRDataIndex::getValue(config,&toggleEvent,&local_70,true);
  (*(VVar3.datum)->_vptr_VRDatum[2])(&trackerName,VVar3.datum);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&toggleEvent);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rotateEvent,"ToggleOnOffEvent",(allocator<char> *)&translateEvent);
  std::__cxx11::string::string((string *)&local_90,(string *)&devNameSpace);
  VVar3 = VRDataIndex::getValue(config,&rotateEvent,&local_90,true);
  (*(VVar3.datum)->_vptr_VRDatum[2])(&toggleEvent,VVar3.datum);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&rotateEvent);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&translateEvent,"RotateEvent",(allocator<char> *)&rollEvent);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&translateZEvent,"Kbdr",(allocator<char> *)&style);
  std::__cxx11::string::string((string *)&local_b0,(string *)&devNameSpace);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&rotateEvent,config,&translateEvent,&translateZEvent,&local_b0,true);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&translateZEvent);
  std::__cxx11::string::~string((string *)&translateEvent);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&translateZEvent,"TranslateEvent",(allocator<char> *)&style);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rollEvent,"Kbdw",(allocator<char> *)&stack0xfffffffffffffb78);
  std::__cxx11::string::string((string *)&local_d0,(string *)&devNameSpace);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&translateEvent,config,&translateZEvent,&rollEvent,&local_d0,true);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&rollEvent);
  std::__cxx11::string::~string((string *)&translateZEvent);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rollEvent,"TranslateZEvent",(allocator<char> *)&stack0xfffffffffffffb78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&style,"Kbdz",(allocator<char> *)&defaultPos);
  std::__cxx11::string::string((string *)&local_f0,(string *)&devNameSpace);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&translateZEvent,config,&rollEvent,&style,&local_f0,true);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&style);
  std::__cxx11::string::~string((string *)&rollEvent);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&style,"RollEvent",(allocator<char> *)&defaultPos);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffb78,"Kbde",(allocator<char> *)&defaultCtr);
  std::__cxx11::string::string((string *)&local_110,(string *)&devNameSpace);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&rollEvent,config,&style,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffb78,&local_110,true);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb78);
  std::__cxx11::string::~string((string *)&style);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&style,"XYTranslationScale",(allocator<char> *)&defaultPos);
  std::__cxx11::string::string((string *)&local_130,(string *)&devNameSpace);
  xyScale = VRDataIndex::getValueWithDefault<float>
                      (config,&style,(float *)&stack0xfffffffffffffb78,&local_130,true);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&style);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&style,"ZTranslationScale",(allocator<char> *)&defaultPos);
  std::__cxx11::string::string((string *)&local_150,(string *)&devNameSpace);
  zScale = VRDataIndex::getValueWithDefault<float>
                     (config,&style,(float *)&stack0xfffffffffffffb78,&local_150,true);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&style);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&style,"RotationScale",(allocator<char> *)&defaultPos);
  std::__cxx11::string::string((string *)&local_170,(string *)&devNameSpace);
  rotScale = VRDataIndex::getValueWithDefault<float>
                       (config,&style,(float *)&stack0xfffffffffffffb78,&local_170,true);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&style);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&style,"Sticky",(allocator<char> *)&defaultPos);
  fVar4 = 0.0;
  std::__cxx11::string::string((string *)&local_190,(string *)&devNameSpace);
  iVar1 = VRDataIndex::getValueWithDefault<int>
                    (config,&style,(int *)&stack0xfffffffffffffb78,&local_190,true);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&style);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffb78,"Style",(allocator<char> *)&defaultCtr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defaultPos,"Looker",(allocator<char> *)&defaultUp);
  std::__cxx11::string::string((string *)&local_1b0,(string *)&devNameSpace);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&style,config,(string *)&stack0xfffffffffffffb78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&defaultPos,
             &local_1b0,true);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&defaultPos);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb78);
  iVar2 = std::__cxx11::string::compare((char *)&style);
  pos[0] = 0.0;
  pos[1] = 0.0;
  pos[2] = -1.0;
  ctr[2] = 0.0;
  ctr[0] = 0.0;
  ctr[1] = 0.0;
  up[0] = 0.0;
  up[1] = 1.0;
  up[2] = 0.0;
  std::vector<float,std::allocator<float>>::vector<float*,void>
            ((vector<float,std::allocator<float>> *)&defaultPos,pos,&local_25c,
             (allocator_type *)&stack0xfffffffffffffb78);
  std::vector<float,std::allocator<float>>::vector<float*,void>
            ((vector<float,std::allocator<float>> *)&defaultCtr,ctr,&local_394,
             (allocator_type *)&stack0xfffffffffffffb78);
  std::vector<float,std::allocator<float>>::vector<float*,void>
            ((vector<float,std::allocator<float>> *)&defaultUp,up,&local_3a4,
             (allocator_type *)&stack0xfffffffffffffb78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffb78,"LookAtEye",(allocator<char> *)&startCtr);
  std::__cxx11::string::string((string *)&local_1d0,(string *)&devNameSpace);
  VRDataIndex::getValueWithDefault<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)&local_298,config,
             (string *)&stack0xfffffffffffffb78,&defaultPos,&local_1d0,true);
  VRVector3::VRVector3(&startPos,(VRFloatArray *)&local_298);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_298);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffb78,"LookAtCenter",(allocator<char> *)&startUp);
  std::__cxx11::string::string((string *)&local_1f0,(string *)&devNameSpace);
  VRDataIndex::getValueWithDefault<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)&local_2b0,config,
             (string *)&stack0xfffffffffffffb78,&defaultCtr,&local_1f0,true);
  VRVector3::VRVector3(&startCtr,(VRFloatArray *)&local_2b0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_2b0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffb78,"LookAtUp",(allocator<char> *)(auStack_470 + 0xf));
  std::__cxx11::string::string((string *)&local_210,(string *)&devNameSpace);
  VRDataIndex::getValueWithDefault<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)&local_2c8,config,
             (string *)&stack0xfffffffffffffb78,&defaultUp,&local_210,true);
  VRVector3::VRVector3(&startUp,(VRFloatArray *)&local_2c8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_2c8);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb78);
  this = (VRFakeTrackerDevice *)operator_new(0x268);
  VRVector3::VRVector3(&local_228,&startPos);
  VRVector3::VRVector3(&local_240,&startCtr);
  VRVector3::VRVector3(&local_258,&startUp);
  lookAtEye._8_8_ = &local_240;
  lookAtEye.super_VRFloatArrayConvertible._vptr_VRFloatArrayConvertible = (_func_int **)&local_228;
  lookAtEye._16_8_ = &local_258;
  lookAtCenter._4_20_ = in_stack_fffffffffffffb7c;
  lookAtCenter.super_VRFloatArrayConvertible._vptr_VRFloatArrayConvertible._0_4_ = fVar4;
  VRFakeTrackerDevice(this,&trackerName,&toggleEvent,&rotateEvent,&rollEvent,&translateEvent,
                      &translateZEvent,xyScale,zScale,rotScale,iVar1 != 0,iVar2 == 0,lookAtEye,
                      lookAtCenter,_auStack_470);
  VRVector3::~VRVector3(&local_258);
  VRVector3::~VRVector3(&local_240);
  VRVector3::~VRVector3(&local_228);
  (**vrMain->_vptr_VRMainInterface)(vrMain,&this->super_VREventHandler);
  VRVector3::~VRVector3(&startUp);
  VRVector3::~VRVector3(&startCtr);
  VRVector3::~VRVector3(&startPos);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&defaultUp.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&defaultCtr.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&defaultPos.super__Vector_base<float,_std::allocator<float>_>);
  std::__cxx11::string::~string((string *)&style);
  std::__cxx11::string::~string((string *)&rollEvent);
  std::__cxx11::string::~string((string *)&translateZEvent);
  std::__cxx11::string::~string((string *)&translateEvent);
  std::__cxx11::string::~string((string *)&rotateEvent);
  std::__cxx11::string::~string((string *)&toggleEvent);
  std::__cxx11::string::~string((string *)&trackerName);
  std::__cxx11::string::~string((string *)&devNameSpace);
  return &this->super_VRInputDevice;
}

Assistant:

VRInputDevice*
VRFakeTrackerDevice::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace) {
    std::string devNameSpace = nameSpace;

    // Find and/or set all the default values.
    std::string trackerName = config->getValue("TrackerName", devNameSpace);
    std::string toggleEvent = config->getValue("ToggleOnOffEvent", devNameSpace);
    std::string rotateEvent = config->getValueWithDefault("RotateEvent",
                                                          std::string("Kbdr"),
                                                          devNameSpace);
    std::string translateEvent = config->getValueWithDefault("TranslateEvent",
                                                             std::string("Kbdw"),
                                                             devNameSpace);
    std::string translateZEvent = config->getValueWithDefault("TranslateZEvent",
                                                              std::string("Kbdz"),
                                                              devNameSpace);
    std::string rollEvent = config->getValueWithDefault("RollEvent",
                                                        std::string("Kbde"),
                                                        devNameSpace);
    float xyScale =
      config->getValueWithDefault("XYTranslationScale", 1.0f, devNameSpace);
    float zScale =
      config->getValueWithDefault("ZTranslationScale", 1.0f, devNameSpace);
    float rScale = config->getValueWithDefault("RotationScale",
                                               3.1415926f, devNameSpace);

    int sticky = config->getValueWithDefault("Sticky", 0, devNameSpace);
    std::string style = config->getValueWithDefault("Style",
                                                    std::string("Looker"),
                                                    devNameSpace);
    // We only have two styles, so we can use a boolean for it.  (Note that the
    // 'compare()' method returns a zero when the strings match.)
    bool seeker = !style.compare("Seeker");

    float pos[] = {0, 0, -1};
    float ctr[] = {0, 0, 0};
    float up[] = {0, 1, 0};
    VRFloatArray defaultPos (pos, pos + sizeof(pos) / sizeof(pos[0]));
    VRFloatArray defaultCtr (ctr, ctr + sizeof(ctr) / sizeof(ctr[0]));
    VRFloatArray defaultUp (up, up + sizeof(up) / sizeof(up[0]));
    VRVector3 startPos = config->getValueWithDefault("LookAtEye",
                                                     defaultPos, devNameSpace);
    VRVector3 startCtr = config->getValueWithDefault("LookAtCenter",
                                                     defaultCtr, devNameSpace);
    VRVector3 startUp = config->getValueWithDefault("LookAtUp",
                                                    defaultUp, devNameSpace);

    // Make a new object.
    VRFakeTrackerDevice *dev = new VRFakeTrackerDevice(trackerName,
                                                       toggleEvent,
                                                       rotateEvent,
                                                       rollEvent,
                                                       translateEvent,
                                                       translateZEvent,
                                                       xyScale,
                                                       zScale,
                                                       rScale,
                                                       sticky,
                                                       seeker,
                                                       startPos,
                                                       startCtr,
                                                       startUp);
    vrMain->addEventHandler(dev);

    return dev;
}